

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makecrct.c
# Opt level: O1

void write_table(uint32_t *table,int k)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (0 < k) {
    uVar4 = 0;
    do {
      iVar1 = (int)((uVar4 & 0xffffffff) / 5);
      pcVar3 = "";
      if ((uVar4 != 0) && (pcVar3 = "    ", (int)uVar4 != iVar1 * 5)) {
        pcVar3 = "";
      }
      pcVar2 = "";
      if ((k - 1 != uVar4) && (pcVar2 = ",\n", iVar1 * -5 + (int)uVar4 != 4)) {
        pcVar2 = ", ";
      }
      printf("%s0x%08x%s",pcVar3,(ulong)table[uVar4],pcVar2);
      uVar4 = uVar4 + 1;
    } while ((uint)k != uVar4);
  }
  return;
}

Assistant:

static void write_table(const uint32_t *table, int k) {
    int n;

    for (n = 0; n < k; n++)
        printf("%s0x%08" PRIx32 "%s", n == 0 || n % 5 ? "" : "    ",
                (uint32_t)(table[n]),
                n == k - 1 ? "" : (n % 5 == 4 ? ",\n" : ", "));
}